

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

ON_ObjRef * __thiscall ON_ObjRef::operator=(ON_ObjRef *this,ON_ObjRef *src)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_ObjRef *src_local;
  ON_ObjRef *this_local;
  
  if (this != src) {
    DecrementProxyReferenceCount(this);
    uVar1 = (src->m_uuid).Data2;
    uVar2 = (src->m_uuid).Data3;
    (this->m_uuid).Data1 = (src->m_uuid).Data1;
    (this->m_uuid).Data2 = uVar1;
    (this->m_uuid).Data3 = uVar2;
    *(undefined8 *)(this->m_uuid).Data4 = *(undefined8 *)(src->m_uuid).Data4;
    this->m_geometry = src->m_geometry;
    this->m_parent_geometry = src->m_parent_geometry;
    this->m_component_index = src->m_component_index;
    this->m_geometry_type = src->m_geometry_type;
    this->m_runtime_sn = src->m_runtime_sn;
    (this->m_point).x = (src->m_point).x;
    (this->m_point).y = (src->m_point).y;
    (this->m_point).z = (src->m_point).z;
    this->m_osnap_mode = src->m_osnap_mode;
    memcpy(&this->m_evp,&src->m_evp,0x60);
    ON_SimpleArray<ON_ObjRef_IRefID>::operator=(&this->m__iref,&src->m__iref);
    this->m__proxy1 = src->m__proxy1;
    this->m__proxy2 = src->m__proxy2;
    this->m__proxy_ref_count = src->m__proxy_ref_count;
    if ((this->m__proxy_ref_count != (int *)0x0) && (0 < *this->m__proxy_ref_count)) {
      *this->m__proxy_ref_count = *this->m__proxy_ref_count + 1;
    }
  }
  return this;
}

Assistant:

ON_ObjRef& ON_ObjRef::operator=( const ON_ObjRef& src ) 
{
  if ( this != &src )
  {
    // Remove any reference this ON_ObjRef class 
    // may currently have.
    DecrementProxyReferenceCount();

    // copy the values from src
    m_uuid = src.m_uuid;
    m_geometry = src.m_geometry;
    m_parent_geometry = src.m_parent_geometry;
    m_component_index = src.m_component_index;
    m_geometry_type = src.m_geometry_type;
    m_runtime_sn = src.m_runtime_sn;
    m_point = src.m_point;
    m_osnap_mode = src.m_osnap_mode;
    m_evp = src.m_evp;
    m__iref = src.m__iref;
    m__proxy1 = src.m__proxy1;
    m__proxy2 = src.m__proxy2;
    m__proxy_ref_count = src.m__proxy_ref_count;

    if ( m__proxy_ref_count && *m__proxy_ref_count > 0 )
    {
      *m__proxy_ref_count = *m__proxy_ref_count + 1;
    }
  }

  return *this;
}